

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnusedBlockPass.cc
# Opt level: O1

bool flow::transform::eliminateUnusedBlocks(IRHandler *handler)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  long *plVar3;
  long *plVar4;
  _List_node_base *p_Var5;
  long *plVar6;
  long **pplVar7;
  list<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_> unused;
  long *local_48;
  undefined1 *local_40;
  long local_38;
  
  local_40 = (undefined1 *)&local_48;
  local_48 = (long *)&local_48;
  local_38 = 0;
  for (p_Var1 = (handler->blocks_).
                super__List_base<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
                ._M_impl._M_node.super__List_node_base._M_next; pplVar7 = &local_48,
      p_Var1 != (_List_node_base *)&handler->blocks_; p_Var1 = p_Var1->_M_next) {
    p_Var2 = p_Var1[1]._M_next;
    if ((p_Var2 != (handler->blocks_).
                   super__List_base<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
                   ._M_impl._M_node.super__List_node_base._M_next[1]._M_next) &&
       (p_Var2[6]._M_prev == p_Var2[7]._M_next)) {
      p_Var5 = (_List_node_base *)operator_new(0x18);
      p_Var5[1]._M_next = p_Var2;
      std::__detail::_List_node_base::_M_hook(p_Var5);
      local_38 = local_38 + 1;
    }
  }
  while (plVar4 = local_48, pplVar7 = (long **)*pplVar7, pplVar7 != &local_48) {
    IRHandler::erase(handler,(BasicBlock *)pplVar7[2]);
  }
  plVar6 = local_48;
  if ((long **)local_48 != &local_48) {
    do {
      plVar3 = (long *)*plVar6;
      operator_delete(plVar6,0x18);
      plVar6 = plVar3;
    } while ((long **)plVar3 != &local_48);
  }
  return (long **)plVar4 != &local_48;
}

Assistant:

bool eliminateUnusedBlocks(IRHandler* handler) {
  std::list<BasicBlock*> unused;

  for (BasicBlock* bb : handler->basicBlocks()) {
    if (bb == handler->getEntryBlock())
      continue;

    if (!bb->predecessors().empty())
      continue;

    unused.push_back(bb);
  }

  for (BasicBlock* bb : unused) {
    // FLOW_TRACE("flow: removing unused BasicBlock {}", bb->name());
    handler->erase(bb);
  }

  return !unused.empty();
}